

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::InsertEndChild(TiXmlNode *this,TiXmlNode *addThis)

{
  int iVar1;
  undefined4 extraout_var;
  TiXmlNode *pTVar2;
  TiXmlDocument *pTVar3;
  
  if (addThis->type == DOCUMENT) {
    pTVar3 = GetDocument(this);
    if (pTVar3 != (TiXmlDocument *)0x0) {
      pTVar3 = GetDocument(this);
      TiXmlDocument::SetError
                (pTVar3,0x10,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
    }
  }
  else {
    iVar1 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(addThis);
    if ((TiXmlNode *)CONCAT44(extraout_var,iVar1) != (TiXmlNode *)0x0) {
      pTVar2 = LinkEndChild(this,(TiXmlNode *)CONCAT44(extraout_var,iVar1));
      return pTVar2;
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::InsertEndChild(const TiXmlNode& addThis) {
	if (addThis.Type() == TiXmlNode::DOCUMENT) {
		if (GetDocument())
			GetDocument()->SetError(TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
		return 0;
	}
	TiXmlNode* node = addThis.Clone();
	if (!node)
		return 0;

	return LinkEndChild(node);
}